

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O2

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DuckTableEntry::RenameColumn
          (DuckTableEntry *this,ClientContext *context,RenameColumnInfo *info)

{
  string *column_name_00;
  ForeignKeyType FVar1;
  pointer pbVar2;
  Catalog *args;
  SchemaCatalogEntry *args_1;
  ClientConfig *pCVar3;
  ClientContext *pCVar4;
  bool bVar5;
  __type _Var6;
  LogicalIndex col;
  pointer pCVar7;
  ColumnDefinition *this_00;
  LogicalIndex LVar8;
  ParsedExpression *expr;
  reference this_01;
  pointer pCVar9;
  CheckConstraint *pCVar10;
  type expr_00;
  UniqueConstraint *this_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *pvVar11;
  ForeignKeyConstraint *pFVar12;
  reference pvVar13;
  Binder *info_00;
  type args_2;
  InternalException *this_03;
  CatalogException *pCVar14;
  RenameColumnInfo *in_RCX;
  ulong __n;
  idx_t i;
  ulong uVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *column_name;
  pointer __lhs;
  ColumnListIterator CVar16;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_290;
  ClientContext *local_288;
  undefined1 local_280 [8];
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
  bound_create_info;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_270;
  optional_ptr<duckdb::CatalogSet,_true> local_268;
  _Alloc_hider local_260;
  ColumnLogicalIteratorInternal __end1;
  Val local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  shared_ptr<duckdb::Binder,_true> binder;
  ColumnDefinition local_108;
  
  column_name_00 = &in_RCX->old_name;
  col = TableCatalogEntry::GetColumnIndex((TableCatalogEntry *)context,column_name_00,false);
  if (col.index == 0xffffffffffffffff) {
    pCVar14 = (CatalogException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&binder,"Cannot rename rowid column",(allocator *)&bound_create_info);
    CatalogException::CatalogException(pCVar14,(string *)&binder);
    __cxa_throw(pCVar14,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
  }
  make_uniq<duckdb::CreateTableInfo,duckdb::SchemaCatalogEntry&,std::__cxx11::string&>
            ((duckdb *)&local_290,
             *(SchemaCatalogEntry **)&(context->config).query_verification_enabled,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &context->interrupted);
  bVar5 = *(bool *)((long)&(context->config).home_directory._M_string_length + 1);
  local_288 = context;
  pCVar7 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_290);
  (pCVar7->super_CreateInfo).temporary = bVar5;
  pCVar7 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_290);
  Value::operator=(&(pCVar7->super_CreateInfo).comment,
                   (Value *)((long)&(local_288->config).home_directory.field_2 + 8));
  pCVar7 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_290);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&(pCVar7->super_CreateInfo).tags,
              (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&(local_288->config).profiler_settings._M_h._M_before_begin);
  CVar16 = ColumnList::Logical((ColumnList *)&(local_288->config).asof_loop_join_threshold);
  local_210.bigint = (int64_t)CVar16.list;
  local_210.hugeint.upper._0_1_ = CVar16.physical;
  ColumnList::ColumnListIterator::begin
            ((ColumnLogicalIteratorInternal *)&bound_create_info,
             (ColumnListIterator *)&local_210.hugeint);
  ColumnList::ColumnListIterator::end(&__end1,(ColumnListIterator *)&local_210.hugeint);
  pCVar3 = &local_288->config;
  while (((local_268.ptr != (CatalogSet *)__end1.pos || (local_260._M_p != (pointer)__end1.end)) ||
         (bound_create_info.
          super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
          .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl !=
          (unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
           )__end1.list))) {
    this_00 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                        ((ColumnLogicalIteratorInternal *)&bound_create_info);
    ColumnDefinition::Copy((ColumnDefinition *)&binder,this_00);
    LVar8 = ColumnDefinition::Logical(this_00);
    if (col.index == LVar8.index) {
      ColumnDefinition::SetName((ColumnDefinition *)&binder,&in_RCX->new_name);
    }
    bVar5 = ColumnDefinition::Generated(this_00);
    if (bVar5) {
      LVar8 = ColumnDefinition::Logical(this_00);
      bVar5 = ColumnDependencyManager::IsDependencyOf
                        ((ColumnDependencyManager *)&(pCVar3->user_variables)._M_h._M_element_count,
                         LVar8,col);
      if (bVar5) {
        expr = ColumnDefinition::GeneratedExpressionMutable((ColumnDefinition *)&binder);
        RenameExpression(expr,in_RCX);
      }
    }
    pCVar7 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_290);
    ColumnDefinition::ColumnDefinition(&local_108,(ColumnDefinition *)&binder);
    ColumnList::AddColumn(&pCVar7->columns,&local_108);
    ColumnDefinition::~ColumnDefinition(&local_108);
    ColumnDefinition::~ColumnDefinition((ColumnDefinition *)&binder);
    local_268.ptr = (CatalogSet *)((long)&(local_268.ptr)->catalog + 1);
  }
  pCVar3 = &local_288->config;
  __n = 0;
  do {
    if ((ulong)((long)((long)(local_288->config).set_variables._M_h._M_single_bucket -
                      (local_288->config).set_variables._M_h._M_rehash_policy._M_next_resize) >> 3)
        <= __n) {
      Binder::CreateBinder
                ((Binder *)&binder,(ClientContext *)info,(optional_ptr<duckdb::Binder,_true>)0x0,
                 REGULAR_BINDER);
      info_00 = shared_ptr<duckdb::Binder,_true>::operator->(&binder);
      pCVar4 = local_288;
      local_280 = (undefined1  [8])local_290._M_head_impl;
      local_290._M_head_impl = (CreateTableInfo *)0x0;
      Binder::BindCreateTableInfo
                ((Binder *)&bound_create_info,
                 (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
                 info_00,(SchemaCatalogEntry *)local_280);
      if (local_280 != (undefined1  [8])0x0) {
        (*(((CreateInfo *)local_280)->super_ParseInfo)._vptr_ParseInfo[1])();
      }
      local_280 = (undefined1  [8])0x0;
      args = (Catalog *)(pCVar4->config).max_expression_depth;
      args_1 = *(SchemaCatalogEntry **)&(pCVar4->config).query_verification_enabled;
      args_2 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
               ::operator*(&bound_create_info);
      make_uniq<duckdb::DuckTableEntry,duckdb::Catalog&,duckdb::SchemaCatalogEntry&,duckdb::BoundCreateTableInfo&,duckdb::shared_ptr<duckdb::DataTable,true>&>
                ((duckdb *)&__end1,args,args_1,args_2,
                 (shared_ptr<duckdb::DataTable,_true> *)
                 &(pCVar4->config).user_variables._M_h._M_bucket_count);
      (this->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.super_CatalogEntry.
      _vptr_CatalogEntry = (_func_int **)__end1.list;
      ::std::
      unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>::
      ~unique_ptr(&bound_create_info.
                   super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
                 );
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (local_290._M_head_impl != (CreateTableInfo *)0x0) {
        (*((local_290._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
      }
      return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
             (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)this;
    }
    this_01 = vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
              ::get<true>((vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                           *)&(pCVar3->set_variables)._M_h._M_rehash_policy._M_next_resize,__n);
    pCVar9 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
             operator->(this_01);
    (*pCVar9->_vptr_Constraint[3])(&__end1,pCVar9);
    pCVar9 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
             operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                         *)&__end1);
    switch(pCVar9->type) {
    case NOT_NULL:
      break;
    case CHECK:
      pCVar9 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
               operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                           *)&__end1);
      pCVar10 = Constraint::Cast<duckdb::CheckConstraint>(pCVar9);
      expr_00 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(&pCVar10->expression);
      RenameExpression(expr_00,in_RCX);
      break;
    case UNIQUE:
      pCVar9 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
               operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                           *)&__end1);
      this_02 = Constraint::Cast<duckdb::UniqueConstraint>(pCVar9);
      pvVar11 = UniqueConstraint::GetColumnNamesMutable_abi_cxx11_(this_02);
      pbVar2 = (pvVar11->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__lhs = (pvVar11->
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; __lhs != pbVar2; __lhs = __lhs + 1) {
        _Var6 = ::std::operator==(__lhs,column_name_00);
        if (_Var6) {
          ::std::__cxx11::string::_M_assign((string *)__lhs);
        }
      }
      break;
    case FOREIGN_KEY:
      pCVar9 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
               operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                           *)&__end1);
      pFVar12 = Constraint::Cast<duckdb::ForeignKeyConstraint>(pCVar9);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&bound_create_info,
               &(pFVar12->pk_columns).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
      FVar1 = (pFVar12->info).type;
      if (FVar1 == FK_TYPE_FOREIGN_KEY_TABLE) {
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&bound_create_info,
                    &(pFVar12->fk_columns).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   );
      }
      else if (FVar1 == FK_TYPE_SELF_REFERENCE_TABLE) {
        for (uVar15 = 0;
            uVar15 < (ulong)((long)(pFVar12->fk_columns).
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pFVar12->fk_columns).
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
            uVar15 = uVar15 + 1) {
          pvVar13 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::get<true>(&pFVar12->fk_columns,uVar15);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&bound_create_info,pvVar13);
        }
      }
      uVar15 = 0;
      while (uVar15 < (ulong)((long)local_270._M_pi -
                              (long)bound_create_info.
                                    super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
                                    ._M_t.
                                    super___uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
                                    .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>.
                                    _M_head_impl >> 5)) {
        pvVar13 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               *)&bound_create_info,uVar15);
        _Var6 = ::std::operator==(pvVar13,column_name_00);
        uVar15 = uVar15 + 1;
        if (_Var6) {
          pCVar14 = (CatalogException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&binder,
                     "Cannot rename column \"%s\" because this is involved in the foreign key constraint"
                     ,(allocator *)&local_210.hugeint);
          ::std::__cxx11::string::string((string *)&local_200,(string *)column_name_00);
          CatalogException::CatalogException<std::__cxx11::string>
                    (pCVar14,(string *)&binder,&local_200);
          __cxa_throw(pCVar14,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&bound_create_info);
      break;
    default:
      this_03 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&binder,"Unsupported constraint for entry!",
                 (allocator *)&bound_create_info);
      InternalException::InternalException(this_03,(string *)&binder);
      __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pCVar7 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_290);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                *)&pCVar7->constraints,
               (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
               &__end1);
    if (__end1.list != (ColumnList *)0x0) {
      (*(code *)((((__end1.list)->columns).
                  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
                  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                  ._M_impl.super__Vector_impl_data._M_start)->name)._M_string_length)();
    }
    __n = __n + 1;
  } while( true );
}

Assistant:

unique_ptr<CatalogEntry> DuckTableEntry::RenameColumn(ClientContext &context, RenameColumnInfo &info) {
	auto rename_idx = GetColumnIndex(info.old_name);
	if (rename_idx.index == COLUMN_IDENTIFIER_ROW_ID) {
		throw CatalogException("Cannot rename rowid column");
	}
	auto create_info = make_uniq<CreateTableInfo>(schema, name);
	create_info->temporary = temporary;
	create_info->comment = comment;
	create_info->tags = tags;
	for (auto &col : columns.Logical()) {
		auto copy = col.Copy();
		if (rename_idx == col.Logical()) {
			copy.SetName(info.new_name);
		}
		if (col.Generated() && column_dependency_manager.IsDependencyOf(col.Logical(), rename_idx)) {
			RenameExpression(copy.GeneratedExpressionMutable(), info);
		}
		create_info->columns.AddColumn(std::move(copy));
	}
	for (idx_t c_idx = 0; c_idx < constraints.size(); c_idx++) {
		auto copy = constraints[c_idx]->Copy();
		switch (copy->type) {
		case ConstraintType::NOT_NULL:
			// NOT NULL constraint: no adjustments necessary
			break;
		case ConstraintType::CHECK: {
			// CHECK constraint: need to rename column references that refer to the renamed column
			auto &check = copy->Cast<CheckConstraint>();
			RenameExpression(*check.expression, info);
			break;
		}
		case ConstraintType::UNIQUE: {
			// UNIQUE constraint: possibly need to rename columns
			auto &unique = copy->Cast<UniqueConstraint>();
			for (auto &column_name : unique.GetColumnNamesMutable()) {
				if (column_name == info.old_name) {
					column_name = info.new_name;
				}
			}
			break;
		}
		case ConstraintType::FOREIGN_KEY: {
			// FOREIGN KEY constraint: possibly need to rename columns
			auto &fk = copy->Cast<ForeignKeyConstraint>();
			vector<string> columns = fk.pk_columns;
			if (fk.info.type == ForeignKeyType::FK_TYPE_FOREIGN_KEY_TABLE) {
				columns = fk.fk_columns;
			} else if (fk.info.type == ForeignKeyType::FK_TYPE_SELF_REFERENCE_TABLE) {
				for (idx_t i = 0; i < fk.fk_columns.size(); i++) {
					columns.push_back(fk.fk_columns[i]);
				}
			}
			for (idx_t i = 0; i < columns.size(); i++) {
				if (columns[i] == info.old_name) {
					throw CatalogException(
					    "Cannot rename column \"%s\" because this is involved in the foreign key constraint",
					    info.old_name);
				}
			}
			break;
		}
		default:
			throw InternalException("Unsupported constraint for entry!");
		}
		create_info->constraints.push_back(std::move(copy));
	}
	auto binder = Binder::CreateBinder(context);
	auto bound_create_info = binder->BindCreateTableInfo(std::move(create_info), schema);
	return make_uniq<DuckTableEntry>(catalog, schema, *bound_create_info, storage);
}